

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::UUID(Value *__return_storage_ptr__,string *value)

{
  hugeint_t hVar1;
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,UUID);
  Value(__return_storage_ptr__,&local_30);
  LogicalType::~LogicalType(&local_30);
  hVar1 = BaseUUID::FromString(value);
  (__return_storage_ptr__->value_).hugeint = hVar1;
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::UUID(const string &value) {
	Value result(LogicalType::UUID);
	result.value_.hugeint = UUID::FromString(value);
	result.is_null = false;
	return result;
}